

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O1

bool __thiscall
Js::SourceTextModuleRecord::ResolveExport
          (SourceTextModuleRecord *this,PropertyId exportName,ResolveSet *resolveSet,
          ModuleNameRecord **exportRecord)

{
  Type *addr;
  ModuleRecordBase *pMVar1;
  IdentPtr pIVar2;
  IdentPtr pIVar3;
  IdentPtr pIVar4;
  code *pcVar5;
  ModuleNameRecord **ppMVar6;
  undefined1 auVar7 [8];
  bool bVar8;
  uint uVar9;
  Type localName;
  int iVar10;
  BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar11;
  Type *pTVar12;
  Type *pTVar13;
  SourceTextModuleRecord *pSVar14;
  byte bVar15;
  ArenaAllocator *alloc;
  SourceTextModuleRecord *pSVar16;
  undefined1 *puVar17;
  SourceTextModuleRecord *local_68;
  ModuleNameRecord *importRecord;
  SourceTextModuleRecord *local_58;
  ModuleNameRecord **local_50;
  undefined1 local_48 [8];
  int i;
  undefined4 uStack_3c;
  uint local_34 [2];
  PropertyId exportName_local;
  
  addr = &this->resolvedExportMap;
  alloc = &((this->scriptContext).ptr)->generalAllocator;
  local_34[0] = exportName;
  if ((this->resolvedExportMap).ptr ==
      (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    local_58 = this;
    pBVar11 = (BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               *)new<Memory::ArenaAllocator>(0x38,alloc,0x366bee);
    pBVar11->buckets = (Type)0x0;
    pBVar11->entries = (Type)0x0;
    pBVar11->alloc = alloc;
    pBVar11->size = 0;
    pBVar11->bucketCount = 0;
    pBVar11->count = 0;
    pBVar11->freeCount = 0;
    pBVar11->modFunctionIndex = 0x4b;
    pBVar11->stats = (Type)0x0;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pBVar11;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    this = local_58;
  }
  local_50 = exportRecord;
  bVar8 = JsUtil::
          BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<int>(addr->ptr,(int *)local_34,exportRecord,(int *)local_48);
  bVar15 = 1;
  if (bVar8) goto LAB_00b13ebd;
  if (resolveSet == (ResolveSet *)0x0) {
    resolveSet = (ResolveSet *)new<Memory::ArenaAllocator>(0x18,alloc,0x366bee);
    ((RealCount *)&((ModuleRecordBase *)resolveSet)->magicNumber)->count = 0;
    (((SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
     &((ModuleRecordBase *)resolveSet)->super_FinalizableObject)->
    super_SListNodeBase<Memory::ArenaAllocator>).next = (Type)resolveSet;
    (((ModuleRecordBase *)resolveSet)->namespaceObject).ptr = (ModuleNamespace *)alloc;
  }
  *local_50 = (ModuleNameRecord *)0x0;
  local_48 = (undefined1  [8])resolveSet;
  _i = (ModuleRecordBase *)resolveSet;
  local_58 = (SourceTextModuleRecord *)__tls_get_addr(&PTR_0155fe48);
  do {
    if (_i == (ModuleRecordBase *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      pSVar14 = local_58;
      *(undefined4 *)local_58 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                  ,0x76,"(current != nullptr)","current != nullptr");
      if (!bVar8) goto LAB_00b13ed1;
      *(undefined4 *)pSVar14 = 0;
    }
    auVar7 = local_48;
    pMVar1 = (ModuleRecordBase *)
             (((SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
              &_i->super_FinalizableObject)->super_SListNodeBase<Memory::ArenaAllocator>).next;
    if ((undefined1  [8])pMVar1 == local_48) {
      _i = (ModuleRecordBase *)0x0;
      goto LAB_00b13a6d;
    }
    _i = pMVar1;
    pTVar12 = SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                        ((Iterator *)local_48);
    pSVar14 = (SourceTextModuleRecord *)(pTVar12->module).ptr;
    Memory::Recycler::WBSetBit((char *)&local_68);
    local_68 = pSVar14;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
    importRecord._0_4_ = pTVar12->bindingName;
  } while ((local_68 != this) || ((uint)importRecord != local_34[0]));
  *local_50 = (ModuleNameRecord *)0x0;
  if ((undefined1  [8])pMVar1 != auVar7) {
    if (*local_50 != (ModuleNameRecord *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      pSVar14 = local_58;
      *(undefined4 *)local_58 = 1;
      bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                  ,0x25d,"(*exportRecord == nullptr)","*exportRecord == nullptr");
      bVar15 = 1;
      if (!bVar8) {
LAB_00b13ed1:
        pcVar5 = (code *)invalidInstructionException();
        (*pcVar5)();
      }
      *(undefined4 *)pSVar14 = 0;
      goto LAB_00b13ebd;
    }
LAB_00b13d57:
    bVar15 = 1;
    goto LAB_00b13ebd;
  }
LAB_00b13a6d:
  uVar9 = local_34[0];
  Memory::Recycler::WBSetBit((char *)local_48);
  local_48 = (undefined1  [8])this;
  Memory::RecyclerWriteBarrierManager::WriteBarrier((Iterator *)local_48);
  _i = (ModuleRecordBase *)CONCAT44(uStack_3c,uVar9);
  SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount>::Prepend
            (&resolveSet->super_SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount>,
             (ArenaAllocator *)(((ModuleRecordBase *)resolveSet)->namespaceObject).ptr,
             (ModuleNameRecord *)local_48);
  local_48 = (undefined1  [8])(this->localExportRecordList).ptr;
  if (local_48 != (undefined1  [8])0x0) {
    _i = (ModuleRecordBase *)local_48;
    do {
      if (_i == (ModuleRecordBase *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        pSVar14 = local_58;
        *(undefined4 *)local_58 = 1;
        bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                    ,0x76,"(current != nullptr)","current != nullptr");
        if (!bVar8) goto LAB_00b13ed1;
        *(undefined4 *)pSVar14 = 0;
      }
      _i = (ModuleRecordBase *)
           (((SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
            &_i->super_FinalizableObject)->super_SListNodeBase<Memory::ArenaAllocator>).next;
      if ((undefined1  [8])_i == local_48) {
        localName = 0xffffffff;
        _i = (ModuleRecordBase *)0x0;
        goto LAB_00b13b79;
      }
      pTVar13 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator::
                Data((Iterator *)local_48);
      pIVar2 = pTVar13->localName;
      pIVar3 = pTVar13->exportName;
      uVar9 = pIVar3->m_propertyId;
      if (uVar9 == 0xffffffff) {
        uVar9 = ScriptContext::GetOrAddPropertyIdTracked
                          ((this->scriptContext).ptr,(LPCWSTR)&pIVar3->field_0x22,pIVar3->m_cch);
        pIVar3->m_propertyId = uVar9;
      }
    } while (uVar9 != local_34[0]);
    localName = pIVar2->m_propertyId;
    if (localName == 0xffffffff) {
      localName = ScriptContext::GetOrAddPropertyIdTracked
                            ((this->scriptContext).ptr,(LPCWSTR)&pIVar2->field_0x22,pIVar2->m_cch);
      pIVar2->m_propertyId = localName;
    }
LAB_00b13b79:
    if (localName != 0xffffffff) {
      local_68 = (SourceTextModuleRecord *)0x0;
      pSVar14 = this;
      if (((this->importRecordList).ptr !=
           (SList<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount> *)0x0) &&
         (bVar8 = ResolveImport(this,localName,(ModuleNameRecord **)&local_68),
         local_68 != (SourceTextModuleRecord *)0x0 && bVar8)) {
        localName = (local_68->super_ModuleRecordBase).magicNumber;
        pSVar14 = (SourceTextModuleRecord *)
                  (local_68->super_ModuleRecordBase).super_FinalizableObject.
                  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject;
      }
      pBVar11 = (this->resolvedExportMap).ptr;
      Memory::Recycler::WBSetBit((char *)local_48);
      local_48 = (undefined1  [8])pSVar14;
      Memory::RecyclerWriteBarrierManager::WriteBarrier((ModuleNameRecord *)local_48);
      _i = (ModuleRecordBase *)CONCAT44(uStack_3c,localName);
      JsUtil::
      BaseDictionary<int,Js::ModuleNameRecord,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<int,Js::ModuleNameRecord,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<int,Js::ModuleNameRecord,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)pBVar11,(int *)local_34,(ModuleNameRecord *)local_48);
      JsUtil::
      BaseDictionary<int,_Js::ModuleNameRecord,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::TryGetReference<int>((this->resolvedExportMap).ptr,(int *)local_34,local_50,(int *)local_48)
      ;
      goto LAB_00b13d57;
    }
  }
  local_48 = (undefined1  [8])(this->indirectExportRecordList).ptr;
  if (local_48 == (undefined1  [8])0x0) {
LAB_00b13d8e:
    if (local_34[0] == 0x6e) {
      bVar15 = 0;
      goto LAB_00b13ebd;
    }
    local_48 = (undefined1  [8])(this->starExportRecordList).ptr;
    if (local_48 == (undefined1  [8])0x0) {
      bVar15 = 0;
    }
    else {
      pSVar14 = (SourceTextModuleRecord *)0x0;
      _i = (ModuleRecordBase *)local_48;
      do {
        pSVar16 = pSVar14;
        if (_i == (ModuleRecordBase *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          pSVar14 = local_58;
          *(undefined4 *)local_58 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar8) goto LAB_00b13ed1;
          *(undefined4 *)pSVar14 = 0;
        }
        _i = (ModuleRecordBase *)
             (((SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
              &_i->super_FinalizableObject)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        bVar15 = 0;
        if ((undefined1  [8])_i == local_48) goto LAB_00b13eaf;
        pTVar13 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)local_48);
        local_68 = (SourceTextModuleRecord *)0x0;
        puVar17 = &pTVar13->moduleRequest->field_0x22;
        pSVar14 = GetChildModuleRecord(this,(LPCOLESTR)puVar17);
        if (pSVar14 == (SourceTextModuleRecord *)0x0) {
          ReleaseParserResourcesForHierarchy(this);
          JavascriptError::ThrowReferenceError
                    ((this->scriptContext).ptr,-0x7ff5e9f2,(PCWSTR)puVar17);
        }
        if ((pSVar14->errorObject).ptr != (void *)0x0) {
          ReleaseParserResourcesForHierarchy(this);
          JavascriptExceptionOperators::Throw((pSVar14->errorObject).ptr,(this->scriptContext).ptr);
        }
        iVar10 = (*(pSVar14->super_ModuleRecordBase).super_FinalizableObject.
                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])
                           (pSVar14,(ulong)local_34[0],resolveSet,&local_68);
        bVar15 = 1;
        if ((char)iVar10 == '\0') goto LAB_00b13eaf;
        pSVar14 = pSVar16;
      } while ((local_68 == (SourceTextModuleRecord *)0x0) ||
              (pSVar14 = local_68, pSVar16 == (SourceTextModuleRecord *)0x0));
      if (((local_68->super_ModuleRecordBase).magicNumber ==
           (pSVar16->super_ModuleRecordBase).magicNumber) &&
         ((local_68->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject ==
          (pSVar16->super_ModuleRecordBase).super_FinalizableObject.super_IRecyclerVisitedObject.
          _vptr_IRecyclerVisitedObject)) {
        bVar15 = 0;
      }
LAB_00b13eaf:
      if (bVar15 == 0) {
        *local_50 = (ModuleNameRecord *)pSVar16;
      }
    }
  }
  else {
    bVar15 = 0;
    _i = (ModuleRecordBase *)local_48;
    while( true ) {
      do {
        if (_i == (ModuleRecordBase *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          pSVar14 = local_58;
          *(undefined4 *)local_58 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                                      ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar8) goto LAB_00b13ed1;
          *(undefined4 *)pSVar14 = 0;
        }
        _i = (ModuleRecordBase *)
             (((SListBase<Js::ModuleNameRecord,_Memory::ArenaAllocator,_RealCount> *)
              &_i->super_FinalizableObject)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])_i == local_48) goto LAB_00b13d6e;
        pTVar13 = SListBase<ModuleImportOrExportEntry,_Memory::ArenaAllocator,_RealCount>::Iterator
                  ::Data((Iterator *)local_48);
        pIVar2 = pTVar13->moduleRequest;
        pIVar3 = pTVar13->importName;
        pIVar4 = pTVar13->exportName;
        uVar9 = pIVar4->m_propertyId;
        if (uVar9 == 0xffffffff) {
          uVar9 = ScriptContext::GetOrAddPropertyIdTracked
                            ((this->scriptContext).ptr,(LPCWSTR)&pIVar4->field_0x22,pIVar4->m_cch);
          pIVar4->m_propertyId = uVar9;
        }
      } while (local_34[0] != uVar9);
      uVar9 = pIVar3->m_propertyId;
      if (uVar9 == 0xffffffff) {
        uVar9 = ScriptContext::GetOrAddPropertyIdTracked
                          ((this->scriptContext).ptr,(LPCWSTR)&pIVar3->field_0x22,pIVar3->m_cch);
        pIVar3->m_propertyId = uVar9;
      }
      puVar17 = &pIVar2->field_0x22;
      pSVar14 = GetChildModuleRecord(this,(LPCOLESTR)puVar17);
      ppMVar6 = local_50;
      if (pSVar14 == (SourceTextModuleRecord *)0x0) {
        ReleaseParserResourcesForHierarchy(this);
        JavascriptError::ThrowReferenceError((this->scriptContext).ptr,-0x7ff5e9f2,(PCWSTR)puVar17);
      }
      if (pIVar3->m_propertyId == 0x70) break;
      iVar10 = (*(pSVar14->super_ModuleRecordBase).super_FinalizableObject.
                 super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[9])
                         (pSVar14,(ulong)uVar9,resolveSet,local_50);
      bVar15 = (byte)iVar10 ^ 1;
      if (((byte)iVar10 != 1) || (*ppMVar6 != (ModuleNameRecord *)0x0)) goto LAB_00b13d6e;
    }
    *local_50 = &pSVar14->namespaceRecord;
LAB_00b13d6e:
    if ((bVar15 & 1) == 0) {
      bVar8 = *local_50 == (ModuleNameRecord *)0x0;
    }
    else {
      bVar8 = false;
    }
    if (bVar8) goto LAB_00b13d8e;
  }
  bVar15 = bVar15 ^ 1;
LAB_00b13ebd:
  return (bool)(bVar15 & 1);
}

Assistant:

bool SourceTextModuleRecord::ResolveExport(PropertyId exportName, ResolveSet* resolveSet, ModuleNameRecord** exportRecord)
    {
        ArenaAllocator* allocator = scriptContext->GeneralAllocator();
        if (resolvedExportMap == nullptr)
        {
            resolvedExportMap = Anew(allocator, ResolvedExportMap, allocator);
        }
        if (resolvedExportMap->TryGetReference(exportName, exportRecord))
        {
            return true;
        }
        // TODO: use per-call/loop allocator?
        if (resolveSet == nullptr)
        {
            resolveSet = Anew(allocator, ResolveSet, allocator);
        }

        *exportRecord = nullptr;
        bool hasCircularRef = false;
        resolveSet->MapUntil([&](ModuleNameRecord moduleNameRecord) {
            if (moduleNameRecord.module == this && moduleNameRecord.bindingName == exportName)
            {
                *exportRecord = nullptr;
                hasCircularRef = true;
                return true;
            }
            return false;
        });
        if (hasCircularRef)
        {
            Assert(*exportRecord == nullptr);
            return true;
        }
        resolveSet->Prepend(ModuleNameRecord(this, exportName));

        if (localExportRecordList != nullptr)
        {
            PropertyId localNameId = Js::Constants::NoProperty;
            localExportRecordList->MapUntil([&](ModuleImportOrExportEntry exportEntry) {
                PropertyId exportNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                if (exportNameId == exportName)
                {
                    localNameId = EnsurePropertyIdForIdentifier(exportEntry.localName);
                    return true;
                }
                return false;
            });
            if (localNameId != Js::Constants::NoProperty)
            {
                // Check to see if we are exporting something we imported from another module without using a re-export.
                // ex: import { foo } from 'module'; export { foo };
                ModuleRecordBase* sourceModule = this;
                ModuleNameRecord* importRecord = nullptr;
                if (this->importRecordList != nullptr
                    && this->ResolveImport(localNameId, &importRecord)
                    && importRecord != nullptr)
                {
                    sourceModule = importRecord->module;
                    localNameId = importRecord->bindingName;
                }
                resolvedExportMap->AddNew(exportName, { sourceModule, localNameId });
                // return the address from Map buffer.
                resolvedExportMap->TryGetReference(exportName, exportRecord);
                return true;
            }
        }

        if (indirectExportRecordList != nullptr)
        {
            bool isAmbiguous = false;
            indirectExportRecordList->MapUntil([&](ModuleImportOrExportEntry exportEntry) {
                PropertyId reexportNameId = EnsurePropertyIdForIdentifier(exportEntry.exportName);
                if (exportName != reexportNameId)
                {
                    return false;
                }

                PropertyId importNameId = EnsurePropertyIdForIdentifier(exportEntry.importName);
                SourceTextModuleRecord* childModuleRecord = GetChildModuleRecord(exportEntry.moduleRequest->Psz());
                if (childModuleRecord == nullptr)
                {
                    this->ReleaseParserResourcesForHierarchy();
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_CannotResolveModule, exportEntry.moduleRequest->Psz());
                }

                if (exportEntry.importName->GetPropertyId() == PropertyIds::star_)
                {
                    // export * as someName from "foo"
                    *exportRecord = childModuleRecord->GetNamespaceNameRecord();
                    return true;
                }

                isAmbiguous = !childModuleRecord->ResolveExport(importNameId, resolveSet, exportRecord);
                if (isAmbiguous)
                {
                    // ambiguous; don't need to search further
                    return true;
                }

                // found a resolution. done;
                if (*exportRecord != nullptr)
                {
                    return true;
                }
                return false;
            });
            if (isAmbiguous)
            {
                return false;
            }
            if (*exportRecord != nullptr)
            {
                return true;
            }
        }

        if (exportName == PropertyIds::default_)
        {
            return false;
        }

        bool ambiguousResolution = false;
        if (this->starExportRecordList != nullptr)
        {
            ModuleNameRecord* starResolution = nullptr;
            starExportRecordList->MapUntil([&](ModuleImportOrExportEntry starExportEntry) {
                ModuleNameRecord* currentResolution = nullptr;
                SourceTextModuleRecord* childModule = GetChildModuleRecord(starExportEntry.moduleRequest->Psz());
                if (childModule == nullptr)
                {
                    this->ReleaseParserResourcesForHierarchy();
                    JavascriptError::ThrowReferenceError(GetScriptContext(), JSERR_CannotResolveModule, starExportEntry.moduleRequest->Psz());
                }
                if (childModule->errorObject != nullptr)
                {
                    this->ReleaseParserResourcesForHierarchy();
                    JavascriptExceptionOperators::Throw(childModule->errorObject, GetScriptContext());
                }

                // if ambiguous, return "ambiguous"
                if (!childModule->ResolveExport(exportName, resolveSet, &currentResolution))
                {
                    ambiguousResolution = true;
                    return true;
                }
                if (currentResolution != nullptr)
                {
                    if (starResolution == nullptr)
                    {
                        starResolution = currentResolution;
                    }
                    else
                    {
                        if (currentResolution->bindingName != starResolution->bindingName ||
                            currentResolution->module != starResolution->module)
                        {
                            ambiguousResolution = true;
                        }
                        return true;
                    }
                }
                return false;
            });
            if (!ambiguousResolution)
            {
                *exportRecord = starResolution;
            }
        }
        return !ambiguousResolution;
    }